

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

Var Js::JavascriptRegExp::EntryGetterFlags(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  charcount_t cchUseLength;
  ScriptContext *pSVar3;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar4;
  RecyclableObject *thisObj_00;
  TempArenaAllocatorObject *this_00;
  ScriptConfiguration *this_01;
  char16 *content;
  JavascriptString *pJVar5;
  ScriptConfiguration *scriptConfig;
  StringBuilder<Memory::ArenaAllocator> bs;
  ArenaAllocator *tempAlloc;
  TempArenaAllocatorObject *temptempAlloc;
  Var flags;
  RecyclableObject *thisObj;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x38f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x390,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar3 = RecyclableObject::GetScriptContext(function);
  thisObj_00 = GetThisObject((Arguments *)&scriptContext,L"RegExp.prototype.flags",pSVar3);
  this_00 = ScriptContext::GetTemporaryAllocator(pSVar3,L"JavascriptRegExp");
  bs._48_8_ = TempArenaAllocatorWrapper<false>::GetAllocator(this_00);
  StringBuilder<Memory::ArenaAllocator>::StringBuilder
            ((StringBuilder<Memory::ArenaAllocator> *)&scriptConfig,(ArenaAllocator *)bs._48_8_,5);
  AppendFlagForFlagsProperty
            ((StringBuilder<Memory::ArenaAllocator> *)&scriptConfig,thisObj_00,0x1a0,L'g',pSVar3);
  AppendFlagForFlagsProperty
            ((StringBuilder<Memory::ArenaAllocator> *)&scriptConfig,thisObj_00,0x1a5,L'i',pSVar3);
  AppendFlagForFlagsProperty
            ((StringBuilder<Memory::ArenaAllocator> *)&scriptConfig,thisObj_00,0x1a3,L'm',pSVar3);
  this_01 = ScriptContext::GetConfig(pSVar3);
  bVar2 = ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_01);
  if (bVar2) {
    AppendFlagForFlagsProperty
              ((StringBuilder<Memory::ArenaAllocator> *)&scriptConfig,thisObj_00,0x1a6,L'u',pSVar3);
  }
  bVar2 = ScriptConfiguration::IsES2018RegExDotAllEnabled(this_01);
  if (bVar2) {
    AppendFlagForFlagsProperty
              ((StringBuilder<Memory::ArenaAllocator> *)&scriptConfig,thisObj_00,0x1a4,L's',pSVar3);
  }
  bVar2 = ScriptConfiguration::IsES6RegExStickyEnabled(this_01);
  if (bVar2) {
    AppendFlagForFlagsProperty
              ((StringBuilder<Memory::ArenaAllocator> *)&scriptConfig,thisObj_00,0x1a7,L'y',pSVar3);
  }
  content = StringBuilder<Memory::ArenaAllocator>::Detach
                      ((StringBuilder<Memory::ArenaAllocator> *)&scriptConfig);
  cchUseLength = StringBuilder<Memory::ArenaAllocator>::Count
                           ((StringBuilder<Memory::ArenaAllocator> *)&scriptConfig);
  pJVar5 = JavascriptString::NewCopyBuffer(content,cchUseLength,pSVar3);
  ScriptContext::ReleaseTemporaryAllocator(pSVar3,this_00);
  return pJVar5;
}

Assistant:

Var JavascriptRegExp::EntryGetterFlags(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        RecyclableObject *thisObj = GetThisObject(args, _u("RegExp.prototype.flags"), scriptContext);
        Var flags;

        BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("JavascriptRegExp"))
        {
            StringBuilder<ArenaAllocator> bs(tempAlloc, 5);

#define APPEND_FLAG(propertyId, flag) AppendFlagForFlagsProperty(&bs, thisObj, propertyId, flag, scriptContext)
            // If you change the order of the flags, don't forget to change it in GetOptions() and ToString() too.
            APPEND_FLAG(PropertyIds::global, _u('g'));
            APPEND_FLAG(PropertyIds::ignoreCase, _u('i'));
            APPEND_FLAG(PropertyIds::multiline, _u('m'));

            ScriptConfiguration const * scriptConfig = scriptContext->GetConfig();

            if (scriptConfig->IsES6UnicodeExtensionsEnabled())
            {
                APPEND_FLAG(PropertyIds::unicode, _u('u'));
            }

            if (scriptConfig->IsES2018RegExDotAllEnabled())
            {
                APPEND_FLAG(PropertyIds::dotAll, _u('s'));
            }

            if (scriptConfig->IsES6RegExStickyEnabled())
            {
                APPEND_FLAG(PropertyIds::sticky, _u('y'));
            }
#undef APPEND_FLAG

            flags = Js::JavascriptString::NewCopyBuffer(bs.Detach(), bs.Count(), scriptContext);
        }
        END_TEMP_ALLOCATOR(tempAlloc, scriptContext);

        return flags;
    }